

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpParser.cpp
# Opt level: O1

void __thiscall GrpParser::languageItemList(GrpParser *this)

{
  RefAST *this_00;
  int iVar1;
  RefAST languageItemList_AST;
  ASTPair currentAST;
  RefCount<AST> local_50;
  ASTPair local_48;
  RefCount<AST> local_30;
  
  this_00 = &(this->super_LLkParser).super_Parser.returnAST;
  RefCount<AST>::operator=(this_00,&nullAST);
  local_50.ref = nullAST.ref;
  local_48.root.ref = (Ref *)0x0;
  local_48.child.ref = (Ref *)0x0;
  if (nullAST.ref == (Ref *)0x0) {
    local_50.ref = (Ref *)0x0;
  }
  else {
    (nullAST.ref)->count = (nullAST.ref)->count + 1;
  }
  do {
    iVar1 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
    if (iVar1 != 0xd) {
      iVar1 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
      if (iVar1 != 0x23) {
        iVar1 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
        if (iVar1 != 0x24) {
          RefCount<AST>::operator=(&local_50,&local_48.root);
          RefCount<AST>::operator=(this_00,&local_50);
          RefCount<AST>::~RefCount(&local_50);
          RefCount<AST>::~RefCount(&local_48.child);
          RefCount<AST>::~RefCount(&local_48.root);
          return;
        }
      }
    }
    languageSpecItem(this);
    local_30.ref = this_00->ref;
    if (local_30.ref == (Ref *)0x0) {
      local_30.ref = (Ref *)0x0;
    }
    else {
      (local_30.ref)->count = (local_30.ref)->count + 1;
    }
    ASTFactory::addASTChild(&(this->super_LLkParser).super_Parser.astFactory,&local_48,&local_30);
    RefCount<AST>::~RefCount(&local_30);
  } while( true );
}

Assistant:

void GrpParser::languageItemList() {
	
	returnAST = nullAST;
	ASTPair currentAST;
	RefAST languageItemList_AST = nullAST;
	
	try {      // for error handling
		{
		do {
			if ((LA(1)==IDENT||LA(1)==LITERAL_language||LA(1)==LITERAL_languages)) {
				languageSpecItem();
				astFactory.addASTChild(currentAST, returnAST);
			}
			else {
				goto _loop173;
			}
			
		} while (true);
		_loop173:;
		}
		languageItemList_AST = currentAST.root;
	}
	catch (ParserException& ex) {
		reportError(ex);
		consume();
		consumeUntil(_tokenSet_46);
	}
	returnAST = languageItemList_AST;
}